

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint32_t rebuild_hflags_a64(CPUARMState_conflict *env,int el,int fp_el,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ARMMMUIdx AVar5;
  TCR *pTVar6;
  uint uVar7;
  ulong uVar8;
  ARMMMUIdx AVar9;
  ARMMMUIdx AVar10;
  
  uVar2 = rebuild_hflags_aprofile(env);
  if (fp_el == 0x10) {
    AVar10 = ARMMMUIdx_Stage1_E0;
  }
  else if (fp_el == 0x13) {
    AVar10 = ARMMMUIdx_Stage1_E1_PAN;
  }
  else {
    AVar10 = fp_el;
    if (fp_el == 0x12) {
      AVar10 = ARMMMUIdx_Stage1_E1;
    }
  }
  if (fp_el == 0x1b) {
    pTVar6 = &(env->cp15).vtcr_el2;
  }
  else {
    uVar3 = regime_el(env,fp_el);
    pTVar6 = (env->cp15).tcr_el + uVar3;
  }
  uVar1 = pTVar6->raw_tcr;
  uVar8 = (ulong)(uint)fp_el;
  uVar4 = (uint)(uVar1 >> 0x20);
  if ((uint)fp_el < 0x23) {
    if ((0x703ef0000U >> (uVar8 & 0x3f) & 1) == 0) {
      uVar7 = 0;
      if (uVar8 != 0x1b) goto LAB_0061de87;
    }
    else {
      uVar7 = uVar4 >> 5 & 3;
    }
  }
  else {
LAB_0061de87:
    uVar7 = ((uint)(uVar1 >> 0x14) & 1) * 3;
  }
  if ((uint)fp_el < 0x23) {
    if ((0x703ef0000U >> (uVar8 & 0x3f) & 1) != 0) {
      uVar4 = uVar4 >> 0x13;
      goto LAB_0061dd4b;
    }
    uVar4 = 0;
    if (uVar8 == 0x1b) goto LAB_0061dd4b;
  }
  uVar4 = ((uint)uVar1 >> 0x1d & 1) * 3;
LAB_0061dd4b:
  AVar9 = uVar7 * 0x1000 + (uVar2 & 0x7fffcffc | ~uVar4 & uVar7) + 0x80000000;
  if ((*(byte *)((long)env[1].xregs + 0x94) & 0xf) != 0) {
    uVar4 = sve_exception_el_aarch64(env,el);
    AVar5 = 0;
    if (uVar4 == 0) {
      uVar2 = sve_zcr_len_for_el_aarch64(env,el);
      AVar5 = uVar2 << 4;
    }
    AVar9 = (AVar9 & 0xffffff03) + (uVar4 & 3) * 4 | AVar5;
  }
  uVar2 = regime_el(env,AVar10);
  uVar1 = (env->cp15).cptr_el[(ulong)uVar2 - 5];
  AVar5 = (uint)(el != 0) * 0x1000000 + 0x1000000;
  AVar10 = AVar9 | 0x10000000;
  if (((ARMMMUIdx)uVar1 & AVar5) == 0) {
    AVar10 = AVar9;
  }
  AVar9 = AVar10 | 0x100;
  if ((env[1].xregs[0x11] & 0xff000ff0) == 0) {
    AVar9 = AVar10;
  }
  if ((uVar1 & 0xc8002000) == 0) {
    AVar9 = AVar10;
  }
  if (((env[1].xregs[0x13] & 0xf) != 0) &&
     (AVar5 = AVar9 | 0x200, (uVar1 & ((ulong)(el != 0) << 0x23) + 0x800000000) != 0)) {
    AVar9 = AVar5;
  }
  if (((env->pstate & 0x800000) == 0) && ((uint)fp_el < 0x1a)) {
    if ((0x30c0000U >> (fp_el & 0x1fU) & 1) == 0) {
      if ((0x600000U >> (fp_el & 0x1fU) & 1) != 0) {
        AVar9 = AVar9 | (uint)(env->cp15).hcr_el2 >> 0xd & 0x4000;
      }
    }
    else {
      AVar9 = AVar9 | 0x4000;
    }
  }
  uVar2 = rebuild_hflags_common(env,fp_el,AVar9,AVar5);
  return uVar2;
}

Assistant:

static uint32_t rebuild_hflags_a64(CPUARMState *env, int el, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);
    ARMMMUIdx stage1 = stage_1_mmu_idx(mmu_idx);
    uint64_t tcr = regime_tcr(env, mmu_idx)->raw_tcr;
    uint64_t sctlr;
    int tbii, tbid;

    FIELD_DP32(flags, TBFLAG_ANY, AARCH64_STATE, 1, flags);

    /* Get control bits for tagged addresses.  */
    tbid = aa64_va_parameter_tbi(tcr, mmu_idx);
    tbii = tbid & ~aa64_va_parameter_tbid(tcr, mmu_idx);

    FIELD_DP32(flags, TBFLAG_A64, TBII, tbii, flags);
    FIELD_DP32(flags, TBFLAG_A64, TBID, tbid, flags);

    if (cpu_isar_feature(aa64_sve, env_archcpu(env))) {
        int sve_el = sve_exception_el(env, el);
        uint32_t zcr_len;

        /*
         * If SVE is disabled, but FP is enabled,
         * then the effective len is 0.
         */
        if (sve_el != 0 && fp_el == 0) {
            zcr_len = 0;
        } else {
            zcr_len = sve_zcr_len_for_el(env, el);
        }
        FIELD_DP32(flags, TBFLAG_A64, SVEEXC_EL, sve_el, flags);
        FIELD_DP32(flags, TBFLAG_A64, ZCR_LEN, zcr_len, flags);
    }

    sctlr = regime_sctlr(env, stage1);

    if (arm_cpu_data_is_big_endian_a64(el, sctlr)) {
        FIELD_DP32(flags, TBFLAG_ANY, BE_DATA, 1, flags);
    }

    if (cpu_isar_feature(aa64_pauth, env_archcpu(env))) {
        /*
         * In order to save space in flags, we record only whether
         * pauth is "inactive", meaning all insns are implemented as
         * a nop, or "active" when some action must be performed.
         * The decision of which action to take is left to a helper.
         */
        if (sctlr & (SCTLR_EnIA | SCTLR_EnIB | SCTLR_EnDA | SCTLR_EnDB)) {
            FIELD_DP32(flags, TBFLAG_A64, PAUTH_ACTIVE, 1, flags);
        }
    }

    if (cpu_isar_feature(aa64_bti, env_archcpu(env))) {
        /* Note that SCTLR_EL[23].BT == SCTLR_BT1.  */
        if (sctlr & (el == 0 ? SCTLR_BT0 : SCTLR_BT1)) {
            FIELD_DP32(flags, TBFLAG_A64, BT, 1, flags);
        }
    }

    /* Compute the condition for using AccType_UNPRIV for LDTR et al. */
    if (!(env->pstate & PSTATE_UAO)) {
        switch (mmu_idx) {
        case ARMMMUIdx_E10_1:
        case ARMMMUIdx_E10_1_PAN:
        case ARMMMUIdx_SE10_1:
        case ARMMMUIdx_SE10_1_PAN:
            /* TODO: ARMv8.3-NV */
            FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            break;
        case ARMMMUIdx_E20_2:
        case ARMMMUIdx_E20_2_PAN:
            /* TODO: ARMv8.4-SecEL2 */
            /*
             * Note that EL20_2 is gated by HCR_EL2.E2H == 1, but EL20_0 is
             * gated by HCR_EL2.<E2H,TGE> == '11', and so is LDTR.
             */
            if (env->cp15.hcr_el2 & HCR_TGE) {
                FIELD_DP32(flags, TBFLAG_A64, UNPRIV, 1, flags);
            }
            break;
        default:
            break;
        }
    }

    return rebuild_hflags_common(env, fp_el, mmu_idx, flags);
}